

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O0

void ylt::metric::detail::stat_io(void)

{
  bool bVar1;
  int iVar2;
  static_metric_manager<ylt::metric::ylt_system_tag_t> *this;
  FILE *pFVar3;
  element_type *peVar4;
  shared_ptr<_IO_FILE> stream_file;
  ProcIO s;
  nullptr_t in_stack_fffffffffffffe98;
  undefined1 *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_static_counter<long> *this_00;
  string *in_stack_fffffffffffffec0;
  string *name;
  static_metric_manager<ylt::metric::ylt_system_tag_t> *in_stack_fffffffffffffec8;
  allocator<char> *in_stack_fffffffffffffed0;
  static_metric_manager<ylt::metric::ylt_system_tag_t> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  __shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 local_c0 [23];
  string local_a9;
  allocator<char> local_81 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_59;
  allocator<char> local_31 [49];
  
  if ((stat_io()::process_io_read_bytes_second == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_io()::process_io_read_bytes_second), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator(local_31);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_io::process_io_read_bytes_second,&__dso_handle);
    __cxa_guard_release(&stat_io()::process_io_read_bytes_second);
  }
  if ((stat_io()::process_io_write_bytes_second == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_io()::process_io_write_bytes_second), iVar2 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    in_stack_fffffffffffffee0 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_io::process_io_write_bytes_second,&__dso_handle);
    __cxa_guard_release(&stat_io()::process_io_write_bytes_second);
  }
  if ((stat_io()::process_io_read_second == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_io()::process_io_read_second), iVar2 != 0)) {
    in_stack_fffffffffffffed8 = static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    in_stack_fffffffffffffed0 = (allocator<char> *)(local_c0 + 0x3f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x3f));
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_io::process_io_read_second,&__dso_handle);
    __cxa_guard_release(&stat_io()::process_io_read_second);
  }
  if ((stat_io()::process_io_write_second == '\0') &&
     (iVar2 = __cxa_guard_acquire(&stat_io()::process_io_write_second), iVar2 != 0)) {
    this = static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    name = (string *)(local_c0 + 0x17);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>(this,name);
    std::__cxx11::string::~string(in_stack_fffffffffffffea0);
    std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x17));
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_io::process_io_write_second,&__dso_handle);
    __cxa_guard_release(&stat_io()::process_io_write_second);
  }
  memset(local_e8,0,0x38);
  pFVar3 = fopen("/proc/self/io","r");
  std::shared_ptr<_IO_FILE>::
  shared_ptr<_IO_FILE,ylt::metric::detail::stat_io()::_lambda(_IO_FILE*)_1_,void>
            ((shared_ptr<_IO_FILE> *)&local_f8,pFVar3);
  bVar1 = std::operator==((shared_ptr<_IO_FILE> *)in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe98);
  if (!bVar1) {
    peVar4 = std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::get(&local_f8);
    value = local_c8;
    this_00 = (basic_static_counter<long> *)local_c0;
    iVar2 = __isoc99_fscanf(peVar4,"%*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu",
                            local_e8,local_e0,local_d8,local_d0,value,this_00,local_c0 + 8);
    if (iVar2 == 7) {
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x27403f);
      basic_static_counter<long>::update(this_00,(long)value);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x27405d);
      basic_static_counter<long>::update(this_00,(long)value);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x27407b);
      basic_static_counter<long>::update(this_00,(long)value);
      std::
      __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x274099);
      basic_static_counter<long>::update(this_00,(long)value);
    }
  }
  std::shared_ptr<_IO_FILE>::~shared_ptr((shared_ptr<_IO_FILE> *)0x2740bd);
  return;
}

Assistant:

inline void stat_io() {
  static auto process_io_read_bytes_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_read_bytes_second");
  static auto process_io_write_bytes_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_write_bytes_second");
  static auto process_io_read_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_read_second");
  static auto process_io_write_second =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_io_write_second");

  ProcIO s{};
#if defined(__APPLE__)
#else
  auto stream_file =
      std::shared_ptr<FILE>(fopen("/proc/self/io", "r"), [](FILE *ptr) {
        fclose(ptr);
      });
  if (stream_file == nullptr) {
    return;
  }

  if (fscanf(stream_file.get(),
             "%*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu %*s %lu",
             &s.rchar, &s.wchar, &s.syscr, &s.syscw, &s.read_bytes,
             &s.write_bytes, &s.cancelled_write_bytes) != 7) {
    return;
  }
#endif

  process_io_read_bytes_second->update(s.rchar);
  process_io_write_bytes_second->update(s.wchar);
  process_io_read_second->update(s.syscr);
  process_io_write_second->update(s.syscw);
}